

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O2

bool __thiscall duckdb::QueryResult::Equals(QueryResult *this,QueryResult *other)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pDVar3;
  ulong col_idx;
  idx_t index;
  idx_t index_00;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> rchunk;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> lchunk;
  Value lvalue;
  Value rvalue;
  
  bVar2 = (this->super_BaseQueryResult).success;
  if (bVar2 == (other->super_BaseQueryResult).success) {
    if (bVar2 == false) {
      bVar2 = ErrorData::operator==
                        (&(this->super_BaseQueryResult).error,&(other->super_BaseQueryResult).error)
      ;
      return bVar2;
    }
    bVar2 = ::std::operator!=(&(this->super_BaseQueryResult).names.
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ,&(other->super_BaseQueryResult).names.
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             );
    if ((!bVar2) &&
       (bVar2 = ::std::operator!=(&(this->super_BaseQueryResult).types.
                                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                  ,&(other->super_BaseQueryResult).types.
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                 ), !bVar2)) {
      lchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
           (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)
           0x0;
      rchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
           (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
           (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)
           0x0;
      index_00 = 0;
      index = 0;
      while( true ) {
        if ((lchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
             super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl ==
             (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>
             )0x0) ||
           (pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator->(&lchunk), index_00 == pDVar3->count)) {
          (*(this->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&lvalue,this);
          uVar1 = lvalue.type_._0_8_;
          lvalue.type_.id_ = INVALID;
          lvalue.type_.physical_type_ = ~INVALID;
          lvalue.type_._2_6_ = 0;
          ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
                    ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                     &lchunk,(pointer)uVar1);
          ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                     &lvalue);
          index_00 = 0;
        }
        if ((rchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
             super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl ==
             (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>
             )0x0) ||
           (pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator->(&rchunk), index == pDVar3->count)) {
          (*(other->super_BaseQueryResult)._vptr_BaseQueryResult[2])(&lvalue,other);
          uVar1 = lvalue.type_._0_8_;
          lvalue.type_.id_ = INVALID;
          lvalue.type_.physical_type_ = ~INVALID;
          lvalue.type_._2_6_ = 0;
          ::std::__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::reset
                    ((__uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                     &rchunk,(pointer)uVar1);
          ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                    ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                     &lvalue);
          index = 0;
        }
        if (lchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t
            .super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
            super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl ==
            (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)
            0x0) break;
        bVar2 = rchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
                _M_t.
                super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
                _M_t.
                super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
                (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>
                 )0x0;
        if ((rchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
             super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl ==
             (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>
             )0x0) ||
           ((pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                      operator->(&lchunk), pDVar3->count == 0 &&
            (pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                      operator->(&rchunk), pDVar3->count == 0)))) goto LAB_00456c60;
        for (; (pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         ::operator->(&lchunk), index_00 < pDVar3->count &&
               (pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                         ::operator->(&rchunk), index < pDVar3->count)); index = index + 1) {
          for (col_idx = 0;
              pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                       operator->(&rchunk),
              col_idx < (ulong)(((long)(pDVar3->data).
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pDVar3->data).
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x68);
              col_idx = col_idx + 1) {
            pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator->(&lchunk);
            DataChunk::GetValue(&lvalue,pDVar3,col_idx,index_00);
            pDVar3 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                     operator->(&rchunk);
            DataChunk::GetValue(&rvalue,pDVar3,col_idx,index);
            if (((lvalue.is_null != true) || ((rvalue.is_null & 1U) == 0)) &&
               ((lvalue.is_null != rvalue.is_null ||
                (bVar2 = Value::operator!=(&lvalue,&rvalue), bVar2)))) {
              Value::~Value(&rvalue);
              Value::~Value(&lvalue);
              bVar2 = false;
              goto LAB_00456c60;
            }
            Value::~Value(&rvalue);
            Value::~Value(&lvalue);
          }
          index_00 = index_00 + 1;
        }
      }
      bVar2 = rchunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
              _M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
              super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl ==
              (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>
               )0x0;
LAB_00456c60:
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                (&rchunk.
                  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
      ::std::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>::~unique_ptr
                (&lchunk.
                  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool QueryResult::Equals(QueryResult &other) { // LCOV_EXCL_START
	// first compare the success state of the results
	if (success != other.success) {
		return false;
	}
	if (!success) {
		return error == other.error;
	}
	// compare names
	if (names != other.names) {
		return false;
	}
	// compare types
	if (types != other.types) {
		return false;
	}
	// now compare the actual values
	// fetch chunks
	unique_ptr<DataChunk> lchunk, rchunk;
	idx_t lindex = 0, rindex = 0;
	while (true) {
		if (!lchunk || lindex == lchunk->size()) {
			lchunk = Fetch();
			lindex = 0;
		}
		if (!rchunk || rindex == rchunk->size()) {
			rchunk = other.Fetch();
			rindex = 0;
		}
		if (!lchunk && !rchunk) {
			return true;
		}
		if (!lchunk || !rchunk) {
			return false;
		}
		if (lchunk->size() == 0 && rchunk->size() == 0) {
			return true;
		}
		D_ASSERT(lchunk->ColumnCount() == rchunk->ColumnCount());
		for (; lindex < lchunk->size() && rindex < rchunk->size(); lindex++, rindex++) {
			for (idx_t col = 0; col < rchunk->ColumnCount(); col++) {
				auto lvalue = lchunk->GetValue(col, lindex);
				auto rvalue = rchunk->GetValue(col, rindex);
				if (lvalue.IsNull() && rvalue.IsNull()) {
					continue;
				}
				if (lvalue.IsNull() != rvalue.IsNull()) {
					return false;
				}
				if (lvalue != rvalue) {
					return false;
				}
			}
		}
	}
}